

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish.cpp
# Opt level: O2

int __thiscall ncnn::Mish::forward_inplace(Mish *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  float fVar9;
  
  uVar3 = bottom_top_blob->h * bottom_top_blob->w;
  sVar1 = bottom_top_blob->cstep;
  sVar2 = bottom_top_blob->elemsize;
  uVar8 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar8;
  }
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar8;
  }
  pvVar7 = bottom_top_blob->data;
  for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      __x = *(float *)((long)pvVar7 + uVar5 * 4);
      fVar9 = __x;
      if (__x <= 20.0) {
        fVar9 = expf(__x);
        if (-20.0 <= __x) {
          fVar9 = logf(fVar9 + 1.0);
        }
      }
      fVar9 = tanhf(fVar9);
      *(float *)((long)pvVar7 + uVar5 * 4) = fVar9 * __x;
    }
    pvVar7 = (void *)((long)pvVar7 + sVar1 * sVar2);
  }
  return 0;
}

Assistant:

int Mish::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            const float MISH_THRESHOLD = 20;
            float x = ptr[i], y;
            if (x > MISH_THRESHOLD)
                y = x;
            else if (x < -MISH_THRESHOLD)
                y = expf(x);
            else
                y = logf(expf(x) + 1);
            ptr[i] = static_cast<float>(x * tanh(y));
        }
    }

    return 0;
}